

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void ixmlNode_free(IXML_Node_conflict *nodeptr)

{
  Nodeptr p_Var1;
  IXML_BeforeFreeNode_t p_Var2;
  IXML_Node_conflict *pIVar3;
  Nodeptr *pp_Var4;
  IXML_Node_conflict *pIVar5;
  IXML_Node_conflict *nodeptr_00;
  
  if (nodeptr != (IXML_Node_conflict *)0x0) {
    p_Var2 = Parser_getBeforeFree();
    pIVar5 = nodeptr->firstChild;
    nodeptr_00 = nodeptr;
    do {
      do {
        while (pIVar3 = pIVar5, pIVar5 = nodeptr_00, pIVar3 != (IXML_Node_conflict *)0x0) {
          nodeptr_00 = pIVar3;
          pIVar5 = pIVar3->firstChild;
        }
        while (pIVar3 = pIVar5, pIVar3 != (IXML_Node_conflict *)0x0) {
          nodeptr_00 = pIVar3;
          pIVar5 = pIVar3->nextSibling;
        }
        pIVar5 = nodeptr_00;
      } while (nodeptr_00->firstChild != (Nodeptr)0x0);
      pIVar5 = nodeptr_00->firstAttr;
      while (pIVar5 != (IXML_Node_conflict *)0x0) {
        p_Var1 = pIVar5->nextSibling;
        ixmlNode_freeSingleNode(pIVar5);
        pIVar5 = p_Var1;
      }
      nodeptr_00->firstAttr = (Nodeptr)0x0;
      if (nodeptr_00 == nodeptr) {
        pIVar5 = (IXML_Node_conflict *)0x0;
      }
      else {
        pIVar5 = nodeptr_00->prevSibling;
        if (pIVar5 == (IXML_Node_conflict *)0x0) {
          pIVar5 = nodeptr_00->parentNode;
          pp_Var4 = &pIVar5->firstChild;
        }
        else {
          pp_Var4 = &pIVar5->nextSibling;
        }
        *pp_Var4 = (Nodeptr)0x0;
      }
      if (p_Var2 != (IXML_BeforeFreeNode_t)0x0) {
        (*p_Var2)(nodeptr_00);
      }
      ixmlNode_freeSingleNode(nodeptr_00);
    } while (nodeptr_00 != nodeptr);
  }
  return;
}

Assistant:

void ixmlNode_free(IXML_Node *nodeptr)
{
	IXML_Node *curr_child;
	IXML_Node *prev_child;
	IXML_Node *next_child;
	IXML_Node *curr_attr;
	IXML_Node *next_attr;

	if (nodeptr) {
#ifdef IXML_HAVE_SCRIPTSUPPORT
		IXML_BeforeFreeNode_t hndlr = Parser_getBeforeFree();
#endif
		prev_child = nodeptr;
		next_child = nodeptr->firstChild;
		do {
			curr_child = next_child;
			do {
				while (curr_child) {
					prev_child = curr_child;
					curr_child = curr_child->firstChild;
				}
				curr_child = prev_child;
				while (curr_child) {
					prev_child = curr_child;
					curr_child = curr_child->nextSibling;
				}
				curr_child = prev_child;
				next_child = curr_child->firstChild;
			} while (next_child);
			/* current is now the last sibling of the last child. */
			/* Delete the attribute nodes of this child */
			/* Attribute nodes only have siblings. */
			curr_attr = curr_child->firstAttr;
			while (curr_attr) {
				next_attr = curr_attr->nextSibling;
				ixmlNode_freeSingleNode(curr_attr);
				curr_attr = next_attr;
			}
			curr_child->firstAttr = 0;
			/* Return */
			if (curr_child != nodeptr) {
				if (curr_child->prevSibling) {
					next_child = curr_child->prevSibling;
					next_child->nextSibling = 0;
				} else {
					next_child = curr_child->parentNode;
					next_child->firstChild = 0;
				}
			}
#ifdef IXML_HAVE_SCRIPTSUPPORT
			if (hndlr) {
				hndlr(curr_child);
			}
#endif
			ixmlNode_freeSingleNode(curr_child);
		} while (curr_child != nodeptr);
	}
}